

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void __thiscall QFormLayout::~QFormLayout(QFormLayout *this)

{
  long lVar1;
  QList<QFormLayoutItem_*> *c;
  
  *(undefined ***)&this->super_QLayout = &PTR_metaObject_007c65b8;
  (this->super_QLayout).super_QLayoutItem._vptr_QLayoutItem =
       (_func_int **)&PTR__QFormLayout_007c66d0;
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  QList<QFormLayoutItem_*>::clear((QList<QFormLayoutItem_*> *)(lVar1 + 0xd8));
  c = (QList<QFormLayoutItem_*> *)(lVar1 + 0xc0);
  qDeleteAll<QList<QFormLayoutItem*>>(c);
  QList<QFormLayoutItem_*>::clear(c);
  QLayout::~QLayout(&this->super_QLayout);
  return;
}

Assistant:

QFormLayout::~QFormLayout()
{
    Q_D(QFormLayout);

    /*
        The clearing and destruction order here is important. We start by clearing
        m_things so that QLayout and the rest of the world know that we don't babysit
        the layout items anymore and don't care if they are destroyed.
    */
    d->m_things.clear();
    qDeleteAll(d->m_matrix.storage());
    d->m_matrix.clear();
}